

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QString>::growAppend
          (QCommonArrayOps<QString> *this,QString *b,QString *e)

{
  bool bVar1;
  QArrayDataPointer<QString> *this_00;
  QCommonArrayOps<QString> *in_RDX;
  QCommonArrayOps<QString> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QArrayDataPointer<QString> *in_stack_ffffffffffffffa0;
  QGenericArrayOps<QString> *in_stack_ffffffffffffffb0;
  GrowthPosition in_stack_ffffffffffffffbc;
  QString *p;
  QArrayDataPointer<QString> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    this_00 = (QArrayDataPointer<QString> *)(((long)in_RDX - (long)in_RSI) / 0x18);
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    p = in_RDI;
    QArrayDataPointer<QString>::QArrayDataPointer(&local_28);
    bVar1 = q_points_into_range<QtPrivate::QCommonArrayOps<QString>,QString_const*>
                      ((QString **)p,in_RDX);
    if (bVar1) {
      QArrayDataPointer<QString>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,
                 (QString **)in_RDI,in_stack_ffffffffffffffa0);
    }
    else {
      QArrayDataPointer<QString>::detachAndGrow
                (this_00,in_stack_ffffffffffffffbc,(qsizetype)in_stack_ffffffffffffffb0,
                 (QString **)in_RDI,in_stack_ffffffffffffffa0);
    }
    QGenericArrayOps<QString>::copyAppend
              (in_stack_ffffffffffffffb0,in_RDI,(QString *)in_stack_ffffffffffffffa0);
    QArrayDataPointer<QString>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }